

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int dsk_filecmp(void *p1,void *p2)

{
  uint v2;
  uint v1;
  int res;
  FINFO **fp2;
  FINFO **fp1;
  void *p2_local;
  void *p1_local;
  
  p1_local._4_4_ = strcmp((char *)(*p1 + 0x108),(char *)(*p2 + 0x108));
  if (p1_local._4_4_ == 0) {
    if (*(int *)(*p1 + 0x214) == *(int *)(*p2 + 0x214)) {
      p1_local._4_4_ = 0;
    }
    else if (*(uint *)(*p1 + 0x214) == 0) {
      p1_local._4_4_ = -1;
    }
    else if (*(uint *)(*p2 + 0x214) == 0) {
      p1_local._4_4_ = 1;
    }
    else {
      p1_local._4_4_ = -1;
      if (*(uint *)(*p1 + 0x214) < *(uint *)(*p2 + 0x214)) {
        p1_local._4_4_ = 1;
      }
    }
  }
  return p1_local._4_4_;
}

Assistant:

static int dsk_filecmp(const void *p1, const void *p2)
{
  FINFO * const *fp1 = p1; /* declare fp1 as pointer to constant pointer to structure finfo */
  FINFO * const *fp2 = p2;
  int res;
  unsigned v1, v2;

  if ((res = strcmp((*fp1)->no_ver_name, (*fp2)->no_ver_name)) != 0) return (res);

  if ((*fp1)->version == (*fp2)->version) return (0);
#ifndef DOS
  if ((v1 = (*fp1)->version) == 0) return (-1);
  if ((v2 = (*fp2)->version) == 0) return (1);
#endif /* DOS */
  return ((v1 < v2) ? 1 : -1);
}